

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O1

void __thiscall
chrono::ChContactContainerSMC::InsertContact
          (ChContactContainerSMC *this,ChCollisionInfo *cinfo,ChMaterialCompositeSMC *cmat)

{
  ChContactable_1vars<3> *objB_00;
  ChContactable_1vars<3> *objB_01;
  int iVar1;
  ChContactable_1vars<3> *objB;
  ChCollisionInfo swapped_cinfo;
  
  objB_00 = (ChContactable_1vars<3> *)cinfo->modelA->mcontactable;
  objB_01 = (ChContactable_1vars<3> *)cinfo->modelB->mcontactable;
  iVar1 = (*(objB_00->super_ChContactable)._vptr_ChContactable[0x10])(objB_00);
  switch(iVar1) {
  case 1:
    iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
    if (iVar1 == 2) {
      _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>
                (&this->contactlist_6_3,&this->lastcontact_6_3,&this->n_added_6_3,
                 &this->super_ChContactContainer,(ChContactable_1vars<6> *)objB_00,objB_01,cinfo,
                 cmat);
    }
    else {
      iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
      if (iVar1 == 1) {
        _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>*>,chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>
                  (&this->contactlist_6_6,&this->lastcontact_6_6,&this->n_added_6_6,
                   &this->super_ChContactContainer,(ChContactable_1vars<6> *)objB_00,
                   (ChContactable_1vars<6> *)objB_01,cinfo,cmat);
      }
      else {
        iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
        if (iVar1 == 3) {
          collision::ChCollisionInfo::ChCollisionInfo(&swapped_cinfo,cinfo,true);
          _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>*>,chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>
                    (&this->contactlist_333_6,&this->lastcontact_333_6,&this->n_added_333_6,
                     &this->super_ChContactContainer,(ChContactable_3vars<3,_3,_3> *)objB_01,
                     (ChContactable_1vars<6> *)objB_00,&swapped_cinfo,cmat);
        }
        else {
          iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
          if (iVar1 == 4) {
            collision::ChCollisionInfo::ChCollisionInfo(&swapped_cinfo,cinfo,true);
            _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>*>,chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>
                      (&this->contactlist_666_6,&this->lastcontact_666_6,&this->n_added_666_6,
                       &this->super_ChContactContainer,(ChContactable_3vars<6,_6,_6> *)objB_01,
                       (ChContactable_1vars<6> *)objB_00,&swapped_cinfo,cmat);
          }
        }
      }
    }
    break;
  case 2:
    iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
    if (iVar1 == 2) {
      _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>
                (&this->contactlist_3_3,&this->lastcontact_3_3,&this->n_added_3_3,
                 &this->super_ChContactContainer,objB_00,objB_01,cinfo,cmat);
    }
    else {
      iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
      if (iVar1 == 1) {
        collision::ChCollisionInfo::ChCollisionInfo(&swapped_cinfo,cinfo,true);
        _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>
                  (&this->contactlist_6_3,&this->lastcontact_6_3,&this->n_added_6_3,
                   &this->super_ChContactContainer,(ChContactable_1vars<6> *)objB_01,objB_00,
                   &swapped_cinfo,cmat);
      }
      else {
        iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
        if (iVar1 == 3) {
          collision::ChCollisionInfo::ChCollisionInfo(&swapped_cinfo,cinfo,true);
          _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>
                    (&this->contactlist_333_3,&this->lastcontact_333_3,&this->n_added_333_3,
                     &this->super_ChContactContainer,(ChContactable_3vars<3,_3,_3> *)objB_01,objB_00
                     ,&swapped_cinfo,cmat);
        }
        else {
          iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
          if (iVar1 == 4) {
            collision::ChCollisionInfo::ChCollisionInfo(&swapped_cinfo,cinfo,true);
            _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>
                      (&this->contactlist_666_3,&this->lastcontact_666_3,&this->n_added_666_3,
                       &this->super_ChContactContainer,(ChContactable_3vars<6,_6,_6> *)objB_01,
                       objB_00,&swapped_cinfo,cmat);
          }
        }
      }
    }
    break;
  case 3:
    iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
    if (iVar1 == 2) {
      _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>
                (&this->contactlist_333_3,&this->lastcontact_333_3,&this->n_added_333_3,
                 &this->super_ChContactContainer,(ChContactable_3vars<3,_3,_3> *)objB_00,objB_01,
                 cinfo,cmat);
    }
    else {
      iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
      if (iVar1 == 1) {
        _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>*>,chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>
                  (&this->contactlist_333_6,&this->lastcontact_333_6,&this->n_added_333_6,
                   &this->super_ChContactContainer,(ChContactable_3vars<3,_3,_3> *)objB_00,
                   (ChContactable_1vars<6> *)objB_01,cinfo,cmat);
      }
      else {
        iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
        if (iVar1 == 3) {
          _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>*>,chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>
                    (&this->contactlist_333_333,&this->lastcontact_333_333,&this->n_added_333_333,
                     &this->super_ChContactContainer,(ChContactable_3vars<3,_3,_3> *)objB_00,
                     (ChContactable_3vars<3,_3,_3> *)objB_01,cinfo,cmat);
        }
        else {
          iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
          if (iVar1 == 4) {
            collision::ChCollisionInfo::ChCollisionInfo(&swapped_cinfo,cinfo,true);
            _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>*>,chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>
                      (&this->contactlist_666_333,&this->lastcontact_666_333,&this->n_added_666_333,
                       &this->super_ChContactContainer,(ChContactable_3vars<6,_6,_6> *)objB_01,
                       (ChContactable_3vars<3,_3,_3> *)objB_00,&swapped_cinfo,cmat);
          }
        }
      }
    }
    break;
  case 4:
    iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
    if (iVar1 == 2) {
      _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>
                (&this->contactlist_666_3,&this->lastcontact_666_3,&this->n_added_666_3,
                 &this->super_ChContactContainer,(ChContactable_3vars<6,_6,_6> *)objB_00,objB_01,
                 cinfo,cmat);
    }
    else {
      iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
      if (iVar1 == 1) {
        _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>*>,chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>
                  (&this->contactlist_666_6,&this->lastcontact_666_6,&this->n_added_666_6,
                   &this->super_ChContactContainer,(ChContactable_3vars<6,_6,_6> *)objB_00,
                   (ChContactable_1vars<6> *)objB_01,cinfo,cmat);
      }
      else {
        iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
        if (iVar1 == 3) {
          _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>*>,chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>
                    (&this->contactlist_666_333,&this->lastcontact_666_333,&this->n_added_666_333,
                     &this->super_ChContactContainer,(ChContactable_3vars<6,_6,_6> *)objB_00,
                     (ChContactable_3vars<3,_3,_3> *)objB_01,cinfo,cmat);
        }
        else {
          iVar1 = (*(objB_01->super_ChContactable)._vptr_ChContactable[0x10])(objB_01);
          if (iVar1 == 4) {
            _OptimalContactInsert<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>*>,chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>
                      (&this->contactlist_666_666,&this->lastcontact_666_666,&this->n_added_666_666,
                       &this->super_ChContactContainer,(ChContactable_3vars<6,_6,_6> *)objB_00,
                       (ChContactable_3vars<6,_6,_6> *)objB_01,cinfo,cmat);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ChContactContainerSMC::InsertContact(const collision::ChCollisionInfo& cinfo, const ChMaterialCompositeSMC& cmat) {
    auto contactableA = cinfo.modelA->GetContactable();
    auto contactableB = cinfo.modelB->GetContactable();

    // CREATE THE CONTACTS
    //
    // Switch among the various cases of contacts: i.e. between a 6-dof variable and another 6-dof variable,
    // or 6 vs 3, etc.
    // These cases are made distinct to exploit the optimization coming from templates and static data sizes
    // in contact types.
    //
    // Notes:
    // 1. this was formerly implemented using dynamic casting and introduced a performance bottleneck.
    // 2. use a switch only for the outer level (nested switch negatively affects performance)

    switch (contactableA->GetContactableType()) {
        case ChContactable::CONTACTABLE_3: {
            auto objA = static_cast<ChContactable_1vars<3>*>(contactableA);
            if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_3) {
                auto objB = static_cast<ChContactable_1vars<3>*>(contactableB);
                // 3_3
                _OptimalContactInsert(contactlist_3_3, lastcontact_3_3, n_added_3_3, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_6) {
                auto objB = static_cast<ChContactable_1vars<6>*>(contactableB);
                // 3_6 -> 6_3
                collision::ChCollisionInfo swapped_cinfo(cinfo, true);
                _OptimalContactInsert(contactlist_6_3, lastcontact_6_3, n_added_6_3, this, objB, objA, swapped_cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_333) {
                auto objB = static_cast<ChContactable_3vars<3, 3, 3>*>(contactableB);
                // 3_333 -> 333_3
                collision::ChCollisionInfo swapped_cinfo(cinfo, true);
                _OptimalContactInsert(contactlist_333_3, lastcontact_333_3, n_added_333_3, this, objB, objA, swapped_cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_666) {
                auto objB = static_cast<ChContactable_3vars<6, 6, 6>*>(contactableB);
                // 3_666 -> 666_3
                collision::ChCollisionInfo swapped_cinfo(cinfo, true);
                _OptimalContactInsert(contactlist_666_3, lastcontact_666_3, n_added_666_3, this, objB, objA, swapped_cinfo, cmat);
            }
        } break;

        case ChContactable::CONTACTABLE_6: {
            auto objA = static_cast<ChContactable_1vars<6>*>(contactableA);
            if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_3) {
                auto objB = static_cast<ChContactable_1vars<3>*>(contactableB);
                // 6_3
                _OptimalContactInsert(contactlist_6_3, lastcontact_6_3, n_added_6_3, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_6) {
                auto objB = static_cast<ChContactable_1vars<6>*>(contactableB);
                // 6_6
                _OptimalContactInsert(contactlist_6_6, lastcontact_6_6, n_added_6_6, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_333) {
                auto objB = static_cast<ChContactable_3vars<3, 3, 3>*>(contactableB);
                // 6_333 -> 333_6
                collision::ChCollisionInfo swapped_cinfo(cinfo, true);
                _OptimalContactInsert(contactlist_333_6, lastcontact_333_6, n_added_333_6, this, objB, objA, swapped_cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_666) {
                auto objB = static_cast<ChContactable_3vars<6, 6, 6>*>(contactableB);
                // 6_666 -> 666_6
                collision::ChCollisionInfo swapped_cinfo(cinfo, true);
                _OptimalContactInsert(contactlist_666_6, lastcontact_666_6, n_added_666_6, this, objB, objA, swapped_cinfo, cmat);
            }
        } break;

        case ChContactable::CONTACTABLE_333: {
            auto objA = static_cast<ChContactable_3vars<3, 3, 3>*>(contactableA);
            if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_3) {
                auto objB = static_cast<ChContactable_1vars<3>*>(contactableB);
                // 333_3
                _OptimalContactInsert(contactlist_333_3, lastcontact_333_3, n_added_333_3, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_6) {
                auto objB = static_cast<ChContactable_1vars<6>*>(contactableB);
                // 333_6
                _OptimalContactInsert(contactlist_333_6, lastcontact_333_6, n_added_333_6, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_333) {
                auto objB = static_cast<ChContactable_3vars<3, 3, 3>*>(contactableB);
                // 333_333
                _OptimalContactInsert(contactlist_333_333, lastcontact_333_333, n_added_333_333, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_666) {
                auto objB = static_cast<ChContactable_3vars<6, 6, 6>*>(contactableB);
                // 333_666 -> 666_333
                collision::ChCollisionInfo swapped_cinfo(cinfo, true);
                _OptimalContactInsert(contactlist_666_333, lastcontact_666_333, n_added_666_333, this, objB, objA, swapped_cinfo, cmat);
            }
        } break;

        case ChContactable::CONTACTABLE_666: {
            auto objA = static_cast<ChContactable_3vars<6, 6, 6>*>(contactableA);
            if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_3) {
                auto objB = static_cast<ChContactable_1vars<3>*>(contactableB);
                // 666_3
                _OptimalContactInsert(contactlist_666_3, lastcontact_666_3, n_added_666_3, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_6) {
                auto objB = static_cast<ChContactable_1vars<6>*>(contactableB);
                // 666_6
                _OptimalContactInsert(contactlist_666_6, lastcontact_666_6, n_added_666_6, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_333) {
                auto objB = static_cast<ChContactable_3vars<3, 3, 3>*>(contactableB);
                // 666_333
                _OptimalContactInsert(contactlist_666_333, lastcontact_666_333, n_added_666_333, this, objA, objB, cinfo, cmat);
            } else if (contactableB->GetContactableType() == ChContactable::CONTACTABLE_666) {
                auto objB = static_cast<ChContactable_3vars<6, 6, 6>*>(contactableB);
                // 666_666
                _OptimalContactInsert(contactlist_666_666, lastcontact_666_666, n_added_666_666, this, objA, objB, cinfo, cmat);
            }
        } break;

        default: {
            //// TODO Fallback to some dynamic-size allocated constraint for cases that were not trapped by the switch
        } break;

    }  // switch(contactableA->GetContactableType())
}